

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_example.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::ApiExample::DealableStreams
          (ApiExample *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *liquidity_providers)

{
  pointer pcVar1;
  BulkSubscriber *pBVar2;
  long lVar3;
  string *psVar4;
  undefined8 *puVar5;
  Tenor *pTVar6;
  Date *pDVar7;
  Date *pDVar8;
  string lp;
  Subject subject3;
  Subject subject2;
  Subject subject1;
  long *local_1a0 [2];
  long local_190 [2];
  long *local_180 [2];
  long local_170 [2];
  undefined8 local_160;
  long *local_158 [2];
  long local_148 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  code *local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  pointer local_e0;
  pointer local_d8;
  undefined8 local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  long *local_b0 [2];
  long local_a0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  Subject local_78 [24];
  Subject local_60 [24];
  Subject local_48 [24];
  
  local_d8 = (liquidity_providers->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_e0 = (liquidity_providers->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (local_d8 != local_e0) {
    do {
      local_158[0] = local_148;
      pcVar1 = (local_d8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_158,pcVar1,pcVar1 + local_d8->_M_string_length);
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(**(code **)(*(long *)(this->subscriber_)._M_t.
                                          super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                          .
                                          super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>
                                          ._M_head_impl + 0x38))();
      bidfx_public_api::price::subject::SubjectFactory::Fx();
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
      bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Spot();
      psVar4 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Spot::LiquidityProvider
                         ((string *)local_180);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"EURUSD","");
      psVar4 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Spot::CurrencyPair(psVar4);
      local_1a0[0] = local_190;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"EUR","");
      bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Currency(psVar4);
      puVar5 = (undefined8 *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Quantity(1230080.11);
      (**(code **)*puVar5)(&local_90,puVar5);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0],local_190[0] + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      local_120 = __cxa_throw;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118);
      pBVar2 = (this->subscriber_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
      lVar3 = *(long *)(*(long *)pBVar2 + -0x30);
      bidfx_public_api::price::subject::Subject::Subject(local_48,(Subject *)&local_90);
      (**(code **)(*(long *)(pBVar2 + lVar3) + 8))(pBVar2 + lVar3,local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      local_160 = (**(code **)(*(long *)(this->subscriber_)._M_t.
                                        super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                        .
                                        super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>
                                        ._M_head_impl + 0x38))();
      bidfx_public_api::price::subject::SubjectFactory::Fx();
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
      bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Forward();
      psVar4 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                         ((string *)local_b0);
      local_1a0[0] = local_190;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"EURUSD","");
      psVar4 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar4);
      local_180[0] = local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"EUR","");
      bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar4);
      pTVar6 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                                  (1000000.0);
      puVar5 = (undefined8 *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar6);
      (**(code **)*puVar5)(&local_c8,puVar5);
      if (local_180[0] != local_170) {
        operator_delete(local_180[0],local_170[0] + 1);
      }
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0],local_190[0] + 1);
      }
      local_120 = __cxa_throw;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118);
      pBVar2 = (this->subscriber_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
      lVar3 = *(long *)(*(long *)pBVar2 + -0x30);
      bidfx_public_api::price::subject::Subject::Subject(local_60,(Subject *)&local_c8);
      (**(code **)(*(long *)(pBVar2 + lVar3) + 8))(pBVar2 + lVar3,local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60);
      local_d0 = (**(code **)(*(long *)(this->subscriber_)._M_t.
                                       super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                       .
                                       super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>
                                       ._M_head_impl + 0x38))();
      bidfx_public_api::price::subject::SubjectFactory::Fx();
      local_160 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
      bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Ndf();
      psVar4 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                         ((string *)local_b0);
      local_1a0[0] = local_190;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"USDKRW","");
      psVar4 = (string *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar4);
      local_180[0] = local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"USD","");
      bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar4);
      pTVar6 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                                  (2000000.0);
      pDVar7 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar6);
      pDVar8 = (Date *)operator_new(0xc);
      bidfx_public_api::tools::Date::Date(pDVar8,0x7e3,0xc,10);
      pDVar7 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::FixingDate
                                 (pDVar7);
      pDVar8 = (Date *)operator_new(0xc);
      bidfx_public_api::tools::Date::Date(pDVar8,0x7e3,0xc,0xc);
      puVar5 = (undefined8 *)
               bidfx_public_api::price::subject::SubjectFactory::FX::Forward::SettlementDate(pDVar7)
      ;
      (**(code **)*puVar5)(&local_138,puVar5);
      if (local_180[0] != local_170) {
        operator_delete(local_180[0],local_170[0] + 1);
      }
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0],local_190[0] + 1);
      }
      local_120 = __cxa_throw;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118);
      pBVar2 = (this->subscriber_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
               .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
      lVar3 = *(long *)(*(long *)pBVar2 + -0x30);
      bidfx_public_api::price::subject::Subject::Subject(local_78,(Subject *)&local_138);
      (**(code **)(*(long *)(pBVar2 + lVar3) + 8))(pBVar2 + lVar3,local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
      if (local_158[0] != local_148) {
        operator_delete(local_158[0],local_148[0] + 1);
      }
      local_d8 = local_d8 + 1;
    } while (local_d8 != local_e0);
  }
  return;
}

Assistant:

void ApiExample::DealableStreams(std::vector<std::string> liquidity_providers)
{
    for (std::string lp : liquidity_providers)
    {
        Subject subject1 = subscriber_->Subjects().Fx().Stream().Spot()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1230080.11)
                .CreateSubject();

        subscriber_->Subscribe(subject1);
        //subscriber_->Unsubscribe(subject1);

        Subject subject2 = subscriber_->Subjects().Fx().Stream().Forward()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1000000)
                .Tenor(Tenor::IN_1_MONTH)
                .CreateSubject();

        subscriber_->Subscribe(subject2);
        //subscriber_->Unsubscribe(subject2);

        Subject subject3 = subscriber_->Subjects().Fx().Stream().Ndf()
                .LiquidityProvider(lp)
                .CurrencyPair("USDKRW")
                .Currency("USD")
                .Quantity(2000000)
                .Tenor(Tenor::IN_1_YEAR)
                .FixingDate(new Date(2019, 12, 10))
                .SettlementDate(new Date(2019, 12, 12))
                .CreateSubject();

        subscriber_->Subscribe(subject3);
        //subscriber_->Unsubscribe(subject3);
    }
}